

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2enc.c
# Opt level: O3

int jpc_enc_encpkt(jpc_enc_t *enc,jas_stream_t *out,int compno,int lvlno,int prcno,uint lyrno)

{
  jpc_enc_cp_t *pjVar1;
  jpc_enc_tile_t *pjVar2;
  jpc_enc_rlvl_t *pjVar3;
  jpc_enc_prc_t *pjVar4;
  jpc_tagtree_t *pjVar5;
  long lVar6;
  uint_fast16_t uVar7;
  uchar *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  jpc_bitstream_t *out_00;
  jpc_tagtreenode_t *pjVar14;
  jpc_ms_t *pjVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  jpc_enc_band_t *pjVar19;
  ulong v;
  long lVar20;
  jpc_enc_cblk_t *pjVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  jpc_enc_band_t *pjVar25;
  jas_stream_t *pjVar26;
  undefined4 in_register_0000008c;
  jpc_enc_pass_t *pjVar27;
  jpc_enc_cblk_t *pjVar28;
  jpc_enc_pass_t *pjVar29;
  jpc_enc_pass_t *pjVar30;
  bool bVar31;
  
  iVar9 = jas_getdbglevel();
  if (9 < iVar9) {
    jas_eprintf("encoding packet begin %d %d %d %d\n",(ulong)(uint)compno,(ulong)(uint)lvlno,
                (ulong)(uint)prcno,CONCAT44(in_register_0000008c,lyrno));
  }
  pjVar1 = enc->cp;
  pjVar2 = enc->curtile;
  if (((pjVar1->tcp).csty & 2) != 0) {
    pjVar15 = jpc_ms_create(0xff91);
    if (pjVar15 == (jpc_ms_t *)0x0) {
      return -1;
    }
    *(long *)&pjVar15->parms = (long)pjVar2->pi->pktno;
    iVar10 = jpc_putms(out,enc->cstate,pjVar15);
    if (iVar10 != 0) {
      return -1;
    }
    jpc_ms_destroy(pjVar15);
  }
  out_00 = jpc_bitstream_sopen(out,"w+");
  if (out_00 == (jpc_bitstream_t *)0x0) {
    abort();
  }
  if ((out_00->openmode_ & 2) == 0) {
    __assert_fail("(outb)->openmode_ & JPC_BITSTREAM_WRITE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                  ,0xd3,
                  "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)");
  }
  iVar22 = out_00->cnt_;
  iVar10 = iVar22 + -1;
  out_00->cnt_ = iVar10;
  if (iVar22 < 1) {
    uVar7 = out_00->buf_;
    pjVar26 = out_00->stream_;
    uVar16 = (uint)uVar7;
    uVar23 = uVar16 & 0xff;
    uVar18 = uVar23 == 0xff ^ 7;
    out_00->cnt_ = uVar18;
    out_00->buf_ = (ulong)(uVar23 << 8 | 1 << uVar18);
    uVar23 = pjVar26->flags_;
    if ((uVar23 & 7) != 0) {
      return -1;
    }
    if ((-1 < pjVar26->rwlimit_) && (pjVar26->rwlimit_ <= pjVar26->rwcnt_)) {
LAB_0013162b:
      pjVar26->flags_ = uVar23 | 4;
      return -1;
    }
    *(byte *)&pjVar26->bufmode_ = (byte)pjVar26->bufmode_ | 0x20;
    iVar10 = pjVar26->cnt_;
    pjVar26->cnt_ = iVar10 + -1;
    if (iVar10 < 1) {
      iVar10 = jas_stream_flushbuf(pjVar26,uVar16 & 0xff);
      if (iVar10 == -1) {
        return -1;
      }
    }
    else {
      pjVar26->rwcnt_ = pjVar26->rwcnt_ + 1;
      puVar8 = pjVar26->ptr_;
      pjVar26->ptr_ = puVar8 + 1;
      *puVar8 = (uchar)uVar7;
    }
  }
  else {
    out_00->buf_ = out_00->buf_ | (long)(1 << ((byte)iVar10 & 0x1f));
  }
  if (9 < iVar9) {
    jas_eprintf("present.\n");
  }
  pjVar3 = pjVar2->tcmpts[compno].rlvls;
  uVar24 = (ulong)pjVar3[lvlno].numbands;
  if (uVar24 != 0) {
    pjVar25 = pjVar3[lvlno].bands;
    pjVar19 = pjVar25 + uVar24;
    do {
      if (pjVar25->data != (jas_matrix_t *)0x0) {
        pjVar4 = pjVar25->prcs;
        pjVar21 = pjVar4[prcno].cblks;
        if ((pjVar21 != (jpc_enc_cblk_t *)0x0) &&
           (uVar23 = pjVar4[prcno].numcblks, (ulong)uVar23 != 0)) {
          lVar20 = 0;
          pjVar28 = pjVar21;
          do {
            if (lyrno == 0) {
              pjVar5 = pjVar4[prcno].nlibtree;
              pjVar14 = jpc_tagtree_getleaf(pjVar5,(int)((ulong)((long)pjVar28 -
                                                                (long)pjVar4[prcno].cblks) >> 3) *
                                                   -0x3b13b13b);
              jpc_tagtree_setvalue(pjVar5,pjVar14,*(int *)((long)&pjVar21->numimsbs + lVar20));
            }
            lVar6 = *(long *)((long)&pjVar21->curpass + lVar20);
            if (((lVar6 != 0) && (*(uint *)(lVar6 + 0x20) == lyrno)) &&
               (*(int *)((long)&pjVar21->numencpasses + lVar20) == 0)) {
              pjVar5 = pjVar4[prcno].incltree;
              pjVar14 = jpc_tagtree_getleaf(pjVar5,(int)((ulong)((long)pjVar28 -
                                                                (long)pjVar4[prcno].cblks) >> 3) *
                                                   -0x3b13b13b);
              jpc_tagtree_setvalue(pjVar5,pjVar14,lyrno);
            }
            pjVar28 = pjVar28 + 1;
            lVar20 = lVar20 + 0x68;
          } while ((ulong)uVar23 * 0x68 - lVar20 != 0);
          if ((ulong)pjVar4[prcno].numcblks != 0) {
            pjVar21 = pjVar4[prcno].cblks;
            pjVar28 = pjVar21 + pjVar4[prcno].numcblks;
            do {
              pjVar29 = pjVar21->curpass;
              if (pjVar29 == (jpc_enc_pass_t *)0x0) {
                bVar31 = false;
              }
              else {
                bVar31 = pjVar29->lyrno == lyrno;
              }
              uVar16 = (uint)bVar31;
              if (pjVar21->numencpasses == 0) {
                pjVar5 = pjVar4[prcno].incltree;
                pjVar14 = jpc_tagtree_getleaf(pjVar5,(int)((ulong)((long)pjVar21 -
                                                                  (long)pjVar4[prcno].cblks) >> 3) *
                                                     -0x3b13b13b);
                iVar10 = jpc_tagtree_encode(pjVar5,pjVar14,lyrno + 1,out_00);
                if (iVar10 < 0) {
                  return -1;
                }
              }
              else {
                if ((out_00->openmode_ & 2) == 0) {
                  __assert_fail("(outb)->openmode_ & JPC_BITSTREAM_WRITE",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                ,0x101,
                                "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                               );
                }
                iVar22 = out_00->cnt_;
                iVar10 = iVar22 + -1;
                out_00->cnt_ = iVar10;
                if (iVar22 < 1) {
                  uVar7 = out_00->buf_;
                  pjVar26 = out_00->stream_;
                  uVar18 = (uint)uVar7;
                  uVar23 = uVar18 & 0xff;
                  uVar17 = uVar23 == 0xff ^ 7;
                  out_00->cnt_ = uVar17;
                  out_00->buf_ = (ulong)(uVar16 << (sbyte)uVar17 | uVar23 << 8);
                  uVar23 = pjVar26->flags_;
                  if ((uVar23 & 7) != 0) {
                    return -1;
                  }
                  if ((-1 < pjVar26->rwlimit_) && (pjVar26->rwlimit_ <= pjVar26->rwcnt_))
                  goto LAB_0013162b;
                  *(byte *)&pjVar26->bufmode_ = (byte)pjVar26->bufmode_ | 0x20;
                  iVar10 = pjVar26->cnt_;
                  pjVar26->cnt_ = iVar10 + -1;
                  if (iVar10 < 1) {
                    iVar10 = jas_stream_flushbuf(pjVar26,uVar18 & 0xff);
                    if (iVar10 == -1) {
                      return -1;
                    }
                  }
                  else {
                    pjVar26->rwcnt_ = pjVar26->rwcnt_ + 1;
                    puVar8 = pjVar26->ptr_;
                    pjVar26->ptr_ = puVar8 + 1;
                    *puVar8 = (uchar)uVar7;
                  }
                }
                else {
                  out_00->buf_ = out_00->buf_ | (long)(int)(uVar16 << ((byte)iVar10 & 0x1f));
                }
              }
              if (9 < iVar9) {
                jas_eprintf("included=%d ",(ulong)uVar16);
              }
              if (bVar31 != false) {
                if (pjVar21->numencpasses == 0) {
                  pjVar5 = pjVar4[prcno].nlibtree;
                  pjVar14 = jpc_tagtree_getleaf(pjVar5,(int)((ulong)((long)pjVar21 -
                                                                    (long)pjVar4[prcno].cblks) >> 3)
                                                       * -0x3b13b13b);
                  iVar10 = jpc_tagtree_encode(pjVar5,pjVar14,1,out_00);
                  if (iVar10 < 0) {
                    return -1;
                  }
                  iVar22 = 2;
                  while (iVar10 == 0) {
                    iVar10 = jpc_tagtree_encode(pjVar4[prcno].nlibtree,pjVar14,iVar22,out_00);
                    iVar22 = iVar22 + 1;
                    if (iVar10 < 0) {
                      return -1;
                    }
                  }
                  if ((pjVar14->known_ == 0) || (iVar22 - pjVar14->value_ != 2)) {
                    __assert_fail("leaf->known_ && i == leaf->value_ + 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                  ,0x116,
                                  "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                                 );
                  }
                }
                for (pjVar30 = pjVar29;
                    (pjVar30 != pjVar21->passes + pjVar21->numpasses && (pjVar30->lyrno == lyrno));
                    pjVar30 = pjVar30 + 1) {
                }
                uVar24 = ((long)pjVar30 - (long)pjVar29 >> 3) * -0x71c71c71c71c71c7;
                uVar23 = (uint)uVar24;
                if ((int)uVar23 < 1) {
                  return -1;
                }
                if (uVar23 == 2) {
                  v = 2;
                  iVar10 = 2;
LAB_00131063:
                  iVar10 = jpc_bitstream_putbits(out_00,iVar10,v);
LAB_00131068:
                  if (iVar10 == -1) {
                    return -1;
                  }
                }
                else {
                  if (uVar23 != 1) {
                    if (uVar23 < 6) {
                      v = (ulong)(uVar23 - 3) | 0xc;
                      iVar10 = 4;
                    }
                    else if (uVar23 < 0x25) {
                      v = (ulong)(uVar23 - 6) | 0x1e0;
                      iVar10 = 9;
                    }
                    else {
                      if (0xa4 < uVar23) {
                        return -1;
                      }
                      v = (ulong)(uVar23 - 0x25) | 0xff80;
                      iVar10 = 0x10;
                    }
                    goto LAB_00131063;
                  }
                  if ((out_00->openmode_ & 2) == 0) {
                    __assert_fail("(out)->openmode_ & JPC_BITSTREAM_WRITE",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                  ,0x72,"int jpc_putnumnewpasses(jpc_bitstream_t *, int)");
                  }
                  iVar10 = out_00->cnt_;
                  out_00->cnt_ = iVar10 + -1;
                  if (iVar10 < 1) {
                    uVar7 = out_00->buf_;
                    pjVar26 = out_00->stream_;
                    uVar16 = (uint)uVar7;
                    uVar23 = uVar16 & 0xff;
                    out_00->buf_ = (ulong)(uVar23 << 8);
                    out_00->cnt_ = uVar23 == 0xff ^ 7;
                    uVar23 = pjVar26->flags_;
                    if ((uVar23 & 7) != 0) {
                      return -1;
                    }
                    if ((pjVar26->rwlimit_ < 0) || (pjVar26->rwcnt_ < pjVar26->rwlimit_)) {
                      *(byte *)&pjVar26->bufmode_ = (byte)pjVar26->bufmode_ | 0x20;
                      iVar10 = pjVar26->cnt_;
                      pjVar26->cnt_ = iVar10 + -1;
                      if (0 < iVar10) {
                        pjVar26->rwcnt_ = pjVar26->rwcnt_ + 1;
                        puVar8 = pjVar26->ptr_;
                        pjVar26->ptr_ = puVar8 + 1;
                        *puVar8 = (uchar)uVar7;
                        goto LAB_00131071;
                      }
                      iVar10 = jas_stream_flushbuf(pjVar26,uVar16 & 0xff);
                      iVar10 = -(uint)(iVar10 == -1);
                      goto LAB_00131068;
                    }
                    goto LAB_0013162b;
                  }
                }
LAB_00131071:
                if (9 < iVar9) {
                  jas_eprintf("numnewpasses=%d ",uVar24 & 0xffffffff);
                }
                if (pjVar29 == pjVar30) {
                  iVar10 = 0;
                }
                else {
                  iVar22 = pjVar29->start;
                  iVar10 = 0;
                  iVar12 = 1;
                  pjVar27 = pjVar29;
                  do {
                    if (pjVar27 == pjVar30 + -1 || pjVar27->term != 0) {
                      iVar13 = pjVar27->end;
                      iVar11 = jpc_int_firstone(iVar13 - iVar22);
                      iVar22 = pjVar21->numlenbits;
                      iVar12 = jpc_floorlog2(iVar12);
                      iVar22 = (iVar11 - (iVar12 + iVar22)) + 1;
                      if (iVar10 < iVar22) {
                        iVar10 = iVar22;
                      }
                      if (iVar10 < 1) {
                        iVar10 = 0;
                      }
                      iVar12 = 1;
                      iVar22 = iVar13;
                    }
                    else {
                      iVar12 = iVar12 + 1;
                    }
                    pjVar27 = pjVar27 + 1;
                  } while (pjVar27 != pjVar30);
                  if (iVar10 == 0) {
                    iVar10 = 0;
                  }
                  else {
                    uVar23 = iVar10 + 1;
                    do {
                      if ((out_00->openmode_ & 2) == 0) {
                        __assert_fail("(out)->openmode_ & JPC_BITSTREAM_WRITE",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                      ,0x61,"int jpc_putcommacode(jpc_bitstream_t *, int)");
                      }
                      iVar12 = out_00->cnt_;
                      iVar22 = iVar12 + -1;
                      out_00->cnt_ = iVar22;
                      if (iVar12 < 1) {
                        uVar7 = out_00->buf_;
                        pjVar26 = out_00->stream_;
                        uVar18 = (uint)uVar7;
                        uVar16 = uVar18 & 0xff;
                        uVar17 = uVar16 == 0xff ^ 7;
                        out_00->cnt_ = uVar17;
                        out_00->buf_ = (ulong)(uVar16 << 8 | 1 << uVar17);
                        uVar16 = pjVar26->flags_;
                        if ((uVar16 & 7) != 0) {
                          return -1;
                        }
                        if ((-1 < pjVar26->rwlimit_) && (pjVar26->rwlimit_ <= pjVar26->rwcnt_))
                        goto LAB_00131646;
                        *(byte *)&pjVar26->bufmode_ = (byte)pjVar26->bufmode_ | 0x20;
                        iVar22 = pjVar26->cnt_;
                        pjVar26->cnt_ = iVar22 + -1;
                        if (iVar22 < 1) {
                          iVar22 = jas_stream_flushbuf(pjVar26,uVar18 & 0xff);
                          if (iVar22 == -1) {
                            return -1;
                          }
                        }
                        else {
                          pjVar26->rwcnt_ = pjVar26->rwcnt_ + 1;
                          puVar8 = pjVar26->ptr_;
                          pjVar26->ptr_ = puVar8 + 1;
                          *puVar8 = (uchar)uVar7;
                        }
                      }
                      else {
                        out_00->buf_ = out_00->buf_ | (long)(1 << ((byte)iVar22 & 0x1f));
                      }
                      uVar23 = uVar23 - 1;
                    } while (1 < uVar23);
                  }
                }
                if ((out_00->openmode_ & 2) == 0) {
                  __assert_fail("(out)->openmode_ & JPC_BITSTREAM_WRITE",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                ,0x65,"int jpc_putcommacode(jpc_bitstream_t *, int)");
                }
                iVar22 = out_00->cnt_;
                out_00->cnt_ = iVar22 + -1;
                if (iVar22 < 1) {
                  uVar7 = out_00->buf_;
                  pjVar26 = out_00->stream_;
                  uVar18 = (uint)uVar7;
                  uVar23 = uVar18 & 0xff;
                  out_00->buf_ = (ulong)(uVar23 << 8);
                  out_00->cnt_ = uVar23 == 0xff ^ 7;
                  uVar16 = pjVar26->flags_;
                  if ((uVar16 & 7) != 0) {
                    return -1;
                  }
                  if ((-1 < pjVar26->rwlimit_) && (pjVar26->rwlimit_ <= pjVar26->rwcnt_)) {
LAB_00131646:
                    pjVar26->flags_ = uVar16 | 4;
                    return -1;
                  }
                  *(byte *)&pjVar26->bufmode_ = (byte)pjVar26->bufmode_ | 0x20;
                  iVar22 = pjVar26->cnt_;
                  pjVar26->cnt_ = iVar22 + -1;
                  if (iVar22 < 1) {
                    iVar22 = jas_stream_flushbuf(pjVar26,uVar18 & 0xff);
                    if (iVar22 == -1) {
                      return -1;
                    }
                  }
                  else {
                    pjVar26->rwcnt_ = pjVar26->rwcnt_ + 1;
                    puVar8 = pjVar26->ptr_;
                    pjVar26->ptr_ = puVar8 + 1;
                    *puVar8 = (uchar)uVar7;
                  }
                }
                pjVar21->numlenbits = pjVar21->numlenbits + iVar10;
                if (pjVar29 != pjVar30) {
                  iVar10 = pjVar29->start;
                  iVar22 = 1;
                  do {
                    if (pjVar29 == pjVar30 + -1 || pjVar29->term != 0) {
                      iVar12 = pjVar29->end;
                      iVar10 = iVar12 - iVar10;
                      iVar11 = jpc_int_firstone(iVar10);
                      iVar13 = pjVar21->numlenbits;
                      iVar22 = jpc_floorlog2(iVar22);
                      iVar22 = iVar22 + iVar13;
                      if (iVar22 <= iVar11) {
                        __assert_fail("jpc_int_firstone(datalen) < cblk->numlenbits + jpc_floorlog2(passcount)"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                      ,0x142,
                                      "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                                     );
                      }
                      iVar13 = jpc_bitstream_putbits(out_00,iVar22,(long)iVar10);
                      iVar22 = 1;
                      iVar10 = iVar12;
                      if (iVar13 == -1) {
                        return -1;
                      }
                    }
                    else {
                      iVar22 = iVar22 + 1;
                    }
                    pjVar29 = pjVar29 + 1;
                  } while (pjVar29 != pjVar30);
                }
              }
              pjVar21 = pjVar21 + 1;
            } while (pjVar21 != pjVar28);
          }
        }
      }
      pjVar25 = pjVar25 + 1;
    } while (pjVar25 != pjVar19);
  }
  jpc_bitstream_outalign(out_00,0);
  jpc_bitstream_close(out_00);
  if (((pjVar1->tcp).csty & 4) != 0) {
    pjVar15 = jpc_ms_create(0xff92);
    if (pjVar15 == (jpc_ms_t *)0x0) {
      return -1;
    }
    iVar10 = jpc_putms(out,enc->cstate,pjVar15);
    if (iVar10 != 0) {
      return -1;
    }
    jpc_ms_destroy(pjVar15);
  }
  pjVar3 = pjVar2->tcmpts[compno].rlvls;
  uVar24 = (ulong)pjVar3[lvlno].numbands;
  if (uVar24 != 0) {
    pjVar25 = pjVar3[lvlno].bands;
    pjVar19 = pjVar25 + uVar24;
    do {
      if (pjVar25->data != (jas_matrix_t *)0x0) {
        pjVar21 = pjVar25->prcs[prcno].cblks;
        if ((pjVar21 != (jpc_enc_cblk_t *)0x0) &&
           (uVar24 = (ulong)pjVar25->prcs[prcno].numcblks, uVar24 != 0)) {
          pjVar28 = pjVar21 + uVar24;
          do {
            pjVar29 = pjVar21->curpass;
            if (pjVar29 != (jpc_enc_pass_t *)0x0) {
              if (pjVar29->lyrno == lyrno) {
                for (pjVar30 = pjVar29; pjVar30 != pjVar21->passes + pjVar21->numpasses;
                    pjVar30 = pjVar30 + 1) {
                  pjVar27 = pjVar30;
                  if (pjVar30->lyrno != lyrno) goto LAB_00131478;
                }
                pjVar27 = (jpc_enc_pass_t *)0x0;
LAB_00131478:
                jas_stream_seek(pjVar21->stream,(long)pjVar29->start,0);
                pjVar26 = pjVar21->stream;
                lVar20 = jas_stream_tell(pjVar26);
                if (lVar20 != pjVar29->start) {
                  __assert_fail("jas_stream_tell(cblk->stream) == startpass->start",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                                ,0x17e,
                                "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                               );
                }
                iVar10 = jas_stream_copy(out,pjVar26,pjVar30[-1].end - pjVar29->start);
                if (iVar10 != 0) {
                  return -1;
                }
                pjVar21->curpass = pjVar27;
                pjVar21->numencpasses =
                     pjVar21->numencpasses +
                     (int)((ulong)((long)pjVar30 - (long)pjVar29) >> 3) * 0x38e38e39;
              }
              else if (pjVar29->lyrno <= lyrno) {
                __assert_fail("pass->lyrno > lyrno",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t2enc.c"
                              ,0x170,
                              "int jpc_enc_encpkt(jpc_enc_t *, jas_stream_t *, int, int, int, unsigned int)"
                             );
              }
            }
            pjVar21 = pjVar21 + 1;
          } while (pjVar21 != pjVar28);
        }
      }
      pjVar25 = pjVar25 + 1;
    } while (pjVar25 != pjVar19);
  }
  if (9 < iVar9) {
    jas_eprintf("encoding packet end\n");
  }
  return 0;
}

Assistant:

int jpc_enc_encpkt(jpc_enc_t *enc, jas_stream_t *out, int compno, int lvlno, int prcno, unsigned lyrno)
{
	jpc_enc_tcmpt_t *comp;
	jpc_enc_rlvl_t *lvl;
	jpc_enc_band_t *band;
	jpc_enc_band_t *endbands;
	jpc_enc_cblk_t *cblk;
	jpc_enc_cblk_t *endcblks;
	jpc_bitstream_t *outb;
	jpc_enc_pass_t *pass;
	jpc_enc_pass_t *startpass;
	jpc_enc_pass_t *lastpass;
	jpc_enc_pass_t *endpass;
	jpc_enc_pass_t *endpasses;
	int i;
	int included;
	int ret;
	jpc_tagtreenode_t *leaf;
	int n;
	int t1;
	int t2;
	int adjust;
	int maxadjust;
	int datalen;
	int numnewpasses;
	int passcount;
	jpc_enc_tile_t *tile;
	jpc_enc_prc_t *prc;
	jpc_enc_cp_t *cp;
	jpc_ms_t *ms;

	JAS_DBGLOG(10, ("encoding packet begin %d %d %d %d\n", compno, lvlno,
	  prcno, lyrno));

	tile = enc->curtile;
	cp = enc->cp;

	if (cp->tcp.csty & JPC_COD_SOP) {
		if (!(ms = jpc_ms_create(JPC_MS_SOP))) {
			return -1;
		}
		ms->parms.sop.seqno = jpc_pi_getind(tile->pi);
		if (jpc_putms(out, enc->cstate, ms)) {
			return -1;
		}
		jpc_ms_destroy(ms);
	}

	if (!(outb = jpc_bitstream_sopen(out, "w+"))) {
		abort();
	}

	if (jpc_bitstream_putbit(outb, 1) == EOF) {
		return -1;
	}
	//JAS_DBGLOG(10, ("\n"));
	JAS_DBGLOG(10, ("present.\n"));

	comp = &tile->tcmpts[compno];
	lvl = &comp->rlvls[lvlno];
	endbands = &lvl->bands[lvl->numbands];
	for (band = lvl->bands; band != endbands; ++band) {
		if (!band->data) {
			continue;
		}
		prc = &band->prcs[prcno];
		if (!prc->cblks) {
			continue;
		}

		endcblks = &prc->cblks[prc->numcblks];
		for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
			if (!lyrno) {
				leaf = jpc_tagtree_getleaf(prc->nlibtree, cblk - prc->cblks);
				jpc_tagtree_setvalue(prc->nlibtree, leaf, cblk->numimsbs);
			}
			pass = cblk->curpass;
			included = (pass && pass->lyrno == lyrno);
			if (included && (!cblk->numencpasses)) {
				assert(pass->lyrno == lyrno);
				leaf = jpc_tagtree_getleaf(prc->incltree,
				  cblk - prc->cblks);
				jpc_tagtree_setvalue(prc->incltree, leaf, pass->lyrno);
			}
		}

		endcblks = &prc->cblks[prc->numcblks];
		for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
			pass = cblk->curpass;
			included = (pass && pass->lyrno == lyrno);
			if (!cblk->numencpasses) {
				leaf = jpc_tagtree_getleaf(prc->incltree,
				  cblk - prc->cblks);
				if (jpc_tagtree_encode(prc->incltree, leaf, lyrno + 1, outb) <
				  0) {
					return -1;
				}
			} else {
				if (jpc_bitstream_putbit(outb, included) == EOF) {
					return -1;
				}
			}
			JAS_DBGLOG(10, ("included=%d ", included));
			if (!included) {
				continue;
			}
			if (!cblk->numencpasses) {
				i = 1;
				leaf = jpc_tagtree_getleaf(prc->nlibtree, cblk - prc->cblks);
				for (;;) {
					if ((ret = jpc_tagtree_encode(prc->nlibtree, leaf, i,
					  outb)) < 0) {
						return -1;
					}
					if (ret) {
						break;
					}
					++i;
				}
				assert(leaf->known_ && i == leaf->value_ + 1);
			}

			endpasses = &cblk->passes[cblk->numpasses];
			startpass = pass;
			endpass = startpass;
			while (endpass != endpasses && endpass->lyrno == lyrno){
				++endpass;
			}
			numnewpasses = endpass - startpass;
			if (jpc_putnumnewpasses(outb, numnewpasses)) {
				return -1;
			}
			JAS_DBGLOG(10, ("numnewpasses=%d ", numnewpasses));

			lastpass = endpass - 1;
			n = startpass->start;
			passcount = 1;
			maxadjust = 0;
			for (pass = startpass; pass != endpass; ++pass) {
				if (pass->term || pass == lastpass) {
					datalen = pass->end - n;
					t1 = jpc_int_firstone(datalen) + 1;
					t2 = cblk->numlenbits + jpc_floorlog2(passcount);
					adjust = JAS_MAX(t1 - t2, 0);
					maxadjust = JAS_MAX(adjust, maxadjust);
					n += datalen;
					passcount = 1;
				} else {
					++passcount;
				}
			}
			if (jpc_putcommacode(outb, maxadjust)) {
				return -1;
			}
			cblk->numlenbits += maxadjust;

			lastpass = endpass - 1;
			n = startpass->start;
			passcount = 1;
			for (pass = startpass; pass != endpass; ++pass) {
				if (pass->term || pass == lastpass) {
					datalen = pass->end - n;
					assert(jpc_int_firstone(datalen) < cblk->numlenbits +
					  jpc_floorlog2(passcount));
					if (jpc_bitstream_putbits(outb, cblk->numlenbits +
					  jpc_floorlog2(passcount), datalen) == EOF) {
						return -1;
					}
					n += datalen;
					passcount = 1;
				} else {
					++passcount;
				}
			}
		}
	}

	jpc_bitstream_outalign(outb, 0);
	jpc_bitstream_close(outb);

	if (cp->tcp.csty & JPC_COD_EPH) {
		if (!(ms = jpc_ms_create(JPC_MS_EPH))) {
			return -1;
		}
		if (jpc_putms(out, enc->cstate, ms)) {
			return -1;
		}
		jpc_ms_destroy(ms);
	}

	comp = &tile->tcmpts[compno];
	lvl = &comp->rlvls[lvlno];
	endbands = &lvl->bands[lvl->numbands];
	for (band = lvl->bands; band != endbands; ++band) {
		if (!band->data) {
			continue;
		}
		prc = &band->prcs[prcno];
		if (!prc->cblks) {
			continue;
		}
		endcblks = &prc->cblks[prc->numcblks];
		for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
			pass = cblk->curpass;

			if (!pass) {
				continue;
			}
			if (pass->lyrno != lyrno) {
				assert(pass->lyrno > lyrno);
				continue;
			}

			endpasses = &cblk->passes[cblk->numpasses];
			startpass = pass;
			endpass = startpass;
			while (endpass != endpasses && endpass->lyrno == lyrno){
				++endpass;
			}
			lastpass = endpass - 1;
			numnewpasses = endpass - startpass;

			jas_stream_seek(cblk->stream, startpass->start, SEEK_SET);
			assert(jas_stream_tell(cblk->stream) == startpass->start);
			if (jas_stream_copy(out, cblk->stream, lastpass->end -
			  startpass->start)) {
				return -1;
			}
			cblk->curpass = (endpass != endpasses) ? endpass : 0;
			cblk->numencpasses += numnewpasses;

		}
	}

	JAS_DBGLOG(10, ("encoding packet end\n"));

	return 0;
}